

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int IDASetLinearSolutionScaling(void *ida_mem,int onoff)

{
  undefined4 in_ESI;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDAMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffd8,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,(IDALsMem *)0x11bc78);
  if (local_4 == 0) {
    if (*(int *)((long)in_stack_ffffffffffffffd8 + 4) == 0) {
      local_4 = -3;
    }
    else {
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x60) = in_ESI;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int IDASetLinearSolutionScaling(void* ida_mem, sunbooleantype onoff)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* check for valid solver type */
  if (!(idals_mem->matrixbased)) { return (IDALS_ILL_INPUT); }

  /* set solution scaling flag */
  idals_mem->scalesol = onoff;

  return (IDALS_SUCCESS);
}